

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O1

HelicsFilter helicsFederateRegisterCloningFilter(HelicsFederate fed,char *name,HelicsError *err)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined1 auVar1 [16];
  Federate *pFVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  size_t sVar4;
  Filter *pFVar5;
  HelicsFilter pvVar6;
  pointer *__ptr;
  string_view name_00;
  __single_object filt;
  FilterObject *local_98;
  _Head_base<0UL,_helics::FilterObject_*,_false> local_90;
  Federate *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  long *local_70;
  size_t local_68;
  long local_60 [2];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  getFedSharedPtr(&local_88,(HelicsError *)fed);
  pFVar2 = local_88;
  if (local_88 == (Federate *)0x0) {
    pvVar6 = (HelicsFilter)0x0;
  }
  else {
    local_98 = (FilterObject *)operator_new(0x58);
    (local_98->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (local_98->buffer)._M_dataplus._M_p = (pointer)0x0;
    (local_98->buffer)._M_string_length = 0;
    (local_98->buffer).field_2._M_allocated_capacity = 0;
    (local_98->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (local_98->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (local_98->uFilter)._M_t.
    super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
    super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
    super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl = (Filter *)0x0;
    (local_98->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_98->cloning = false;
    local_98->custom = false;
    *(undefined2 *)&local_98->field_0x2 = 0;
    local_98->valid = 0;
    local_98->filtPtr = (Filter *)0x0;
    *(undefined8 *)((long)&(local_98->buffer).field_2 + 8) = 0;
    (local_98->buffer)._M_dataplus._M_p = (pointer)&(local_98->buffer).field_2;
    (local_98->buffer)._M_string_length = 0;
    (local_98->buffer).field_2._M_local_buf[0] = '\0';
    local_48 = 0;
    local_40 = 0;
    local_70 = local_60;
    local_50 = &local_40;
    if (name == (char *)0x0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                 gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                 gHelicsEmptyStr_abi_cxx11_._M_string_length);
    }
    else {
      sVar4 = strlen(name);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,name,name + sVar4);
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = &local_40;
    name_00._M_str = (char *)local_70;
    name_00._M_len = local_68;
    pFVar5 = &helics::make_cloning_filter(CLONE,pFVar2,(string_view)(auVar1 << 0x40),name_00)->
              super_Filter;
    local_98->filtPtr = pFVar5;
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    p_Var3 = p_Stack_80;
    pFVar2 = local_88;
    local_88 = (Federate *)0x0;
    p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (local_98->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    (local_98->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         pFVar2;
    (local_98->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var3;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    local_98->cloning = true;
    local_90._M_head_impl = local_98;
    local_98 = (FilterObject *)0x0;
    pvVar6 = anon_unknown.dwarf_bbcfa::federateAddFilter
                       (fed,(unique_ptr<helics::FilterObject,_std::default_delete<helics::FilterObject>_>
                             *)&local_90);
    if (local_90._M_head_impl != (FilterObject *)0x0) {
      std::default_delete<helics::FilterObject>::operator()
                ((default_delete<helics::FilterObject> *)&local_90,local_90._M_head_impl);
    }
    local_90._M_head_impl = (FilterObject *)0x0;
    if (local_98 != (FilterObject *)0x0) {
      std::default_delete<helics::FilterObject>::operator()
                ((default_delete<helics::FilterObject> *)&local_98,local_98);
    }
  }
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  return pvVar6;
}

Assistant:

HelicsFilter helicsFederateRegisterCloningFilter(HelicsFederate fed, const char* name, HelicsError* err)
{
    auto fedObj = getFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }

    try {
        auto filt = std::make_unique<helics::FilterObject>();
        filt->filtPtr = &helics::make_cloning_filter(helics::FilterTypes::CLONE, fedObj.get(), std::string{}, AS_STRING(name));
        filt->fedptr = std::move(fedObj);
        filt->cloning = true;
        return federateAddFilter(fed, std::move(filt));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}